

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::emplace<std::pair<QString,QString>>
          (QMovableArrayOps<std::pair<QString,QString>> *this,qsizetype i,
          pair<QString,_QString> *args)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Inserter local_80;
  pair<QString,_QString> local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar2 = QArrayDataPointer<std::pair<QString,_QString>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<std::pair<QString,_QString>_> *)this);
      if (qVar2 == 0) goto LAB_00249673;
      std::pair<QString,_QString>::pair
                ((pair<QString,_QString> *)(*(long *)(this + 0x10) * 0x30 + *(long *)(this + 8)),
                 args);
LAB_00249762:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_00249721;
    }
LAB_00249673:
    if (i == 0) {
      qVar2 = QArrayDataPointer<std::pair<QString,_QString>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<std::pair<QString,_QString>_> *)this);
      if (qVar2 != 0) {
        std::pair<QString,_QString>::pair
                  ((pair<QString,_QString> *)(*(long *)(this + 8) + -0x30),args);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
        goto LAB_00249762;
      }
    }
  }
  local_58.second.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.second.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.first.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.second.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.first.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.first.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  std::pair<QString,_QString>::pair(&local_58,args);
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QString,_QString>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QString,_QString>_> *)this,(uint)(i == 0 && lVar1 != 0),1,
             (pair<QString,_QString> **)0x0,(QArrayDataPointer<std::pair<QString,_QString>_> *)0x0);
  if (i == 0 && lVar1 != 0) {
    std::pair<QString,_QString>::pair
              ((pair<QString,_QString> *)(*(long *)(this + 8) + -0x30),&local_58);
    *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<std::pair<QString,_QString>_>::Inserter::Inserter
              (&local_80,(QArrayDataPointer<std::pair<QString,_QString>_> *)this,i,1);
    std::pair<QString,_QString>::pair(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  std::pair<QString,_QString>::~pair(&local_58);
LAB_00249721:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }